

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O2

void __thiscall
flow::lang::ASTPrinter::print
          (ASTPrinter *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flow::lang::Expr_*>
          *node,size_t pos)

{
  char *__format;
  char buf [1024];
  char acStack_418 [1032];
  
  if ((node->first)._M_string_length == 0) {
    __format = "param #%zu:";
  }
  else {
    pos = (size_t)(node->first)._M_dataplus._M_p;
    __format = "%s:";
  }
  snprintf(acStack_418,0x400,__format,pos);
  print(this,acStack_418,&node->second->super_ASTNode);
  return;
}

Assistant:

void ASTPrinter::print(const std::pair<std::string, Expr*>& node, size_t pos) {
  char buf[1024];
  if (!node.first.empty()) {
    snprintf(buf, sizeof(buf), "%s:", node.first.c_str());
  } else {
    snprintf(buf, sizeof(buf), "param #%zu:", pos);
  }
  print(buf, node.second);
}